

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O2

void * tlb_vaddr_to_host_m68k
                 (CPUArchState_conflict3 *env,abi_ptr_conflict addr,MMUAccessType access_type,
                 int mmu_idx)

{
  _Bool _Var1;
  char cVar2;
  uint uVar3;
  uint *puVar4;
  uint uVar5;
  ulong uVar6;
  size_t mmu_idx_00;
  void *pvVar7;
  long lVar8;
  CPUM68KState_conflict *__mptr;
  
  if (MMU_INST_FETCH < access_type) {
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cputlb.c"
               ,0x4f9,(char *)0x0);
  }
  mmu_idx_00 = (size_t)mmu_idx;
  uVar5 = env->dregs[mmu_idx_00 * 4 + -0xc] >> 6 & addr >> 0xc;
  lVar8 = (ulong)(uVar5 << 6) + *(long *)(env->dregs + mmu_idx_00 * 4 + -10);
  uVar6 = (ulong)access_type;
  uVar3 = *(uint *)(lVar8 + uVar6 * 4);
  if ((uVar3 & 0xfffff800) != (addr & 0xfffff000)) {
    _Var1 = victim_tlb_hit(env,mmu_idx_00,(ulong)uVar5,uVar6 * 4,addr & 0xfffff000);
    if (_Var1) {
      puVar4 = (uint *)(uVar6 * 4 + lVar8);
    }
    else {
      cVar2 = (**(code **)(env[-3].fregs[3].d.low + 0x48))
                        (env[-0x40].fregs + 2,(ulong)addr,0,access_type,mmu_idx,1,0);
      if (cVar2 == '\0') {
        return (void *)0x0;
      }
      lVar8 = (ulong)((addr >> 0xc & env->dregs[mmu_idx_00 * 4 + -0xc] >> 6) << 6) +
              *(long *)(env->dregs + mmu_idx_00 * 4 + -10);
      puVar4 = (uint *)(uVar6 * 4 + lVar8);
    }
    uVar3 = *puVar4;
  }
  if ((uVar3 & 0xfff) == 0) {
    pvVar7 = (void *)((ulong)addr + *(long *)(lVar8 + 0x10));
  }
  else {
    pvVar7 = (void *)0x0;
  }
  return pvVar7;
}

Assistant:

void *tlb_vaddr_to_host(CPUArchState *env, abi_ptr addr,
                        MMUAccessType access_type, int mmu_idx)
{
    struct uc_struct *uc = env->uc;
    CPUTLBEntry *entry = tlb_entry(env, mmu_idx, addr);
    target_ulong tlb_addr, page;
    size_t elt_ofs = 0;

    switch (access_type) {
    case MMU_DATA_LOAD:
        elt_ofs = offsetof(CPUTLBEntry, addr_read);
        break;
    case MMU_DATA_STORE:
        elt_ofs = offsetof(CPUTLBEntry, addr_write);
        break;
    case MMU_INST_FETCH:
        elt_ofs = offsetof(CPUTLBEntry, addr_code);
        break;
    default:
        g_assert_not_reached();
    }

    page = addr & TARGET_PAGE_MASK;
    tlb_addr = tlb_read_ofs(entry, elt_ofs);

    if (!tlb_hit_page(uc, tlb_addr, page)) {
        uintptr_t index = tlb_index(env, mmu_idx, addr);

        if (!victim_tlb_hit(env, mmu_idx, index, elt_ofs, page)) {
            CPUState *cs = env_cpu(env);
            CPUClass *cc = CPU_GET_CLASS(cs);

            if (!cc->tlb_fill(cs, addr, 0, access_type, mmu_idx, true, 0)) {
                /* Non-faulting page table read failed.  */
                return NULL;
            }

            /* TLB resize via tlb_fill may have moved the entry.  */
            entry = tlb_entry(env, mmu_idx, addr);
        }
        tlb_addr = tlb_read_ofs(entry, elt_ofs);
    }

    if (tlb_addr & ~TARGET_PAGE_MASK) {
        /* IO access */
        return NULL;
    }

    return (void *)((uintptr_t)addr + entry->addend);
}